

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall slang::parsing::Lexer::scanWhitespace(Lexer *this)

{
  byte *pbVar1;
  bool bVar2;
  TriviaKind local_11;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  pbVar1 = (byte *)this->sourceBuffer;
  bVar2 = false;
  do {
    if (((ulong)*pbVar1 < 0x21) && ((0x100001a00U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0)) {
      pbVar1 = pbVar1 + 1;
      this->sourceBuffer = (char *)pbVar1;
    }
    else {
      bVar2 = true;
    }
  } while (!bVar2);
  local_11 = Whitespace;
  local_10._M_str = this->marker;
  local_10._M_len = (size_t)(uint)(*(int *)&this->sourceBuffer - (int)local_10._M_str);
  SmallVectorBase<slang::parsing::Trivia>::
  emplace_back<slang::parsing::TriviaKind&,std::basic_string_view<char,std::char_traits<char>>>
            (&(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>,&local_11,&local_10
            );
  return;
}

Assistant:

void Lexer::scanWhitespace() {
    bool done = false;
    while (!done) {
        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                break;
            default:
                done = true;
                break;
        }
    }
    addTrivia(TriviaKind::Whitespace);
}